

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O0

apx_error_t
apx_nodeInstance_create_provide_port
          (apx_nodeInstance_t *self,apx_portId_t port_id,char *name,apx_program_t *pack_program,
          uint32_t data_offset,uint32_t *data_size)

{
  uint32_t *data_size_local;
  uint32_t data_offset_local;
  apx_program_t *pack_program_local;
  char *name_local;
  apx_portId_t port_id_local;
  apx_nodeInstance_t *self_local;
  
  if ((self == (apx_nodeInstance_t *)0x0) || (self->num_provide_ports <= port_id)) {
    self_local._4_4_ = 1;
  }
  else {
    apx_portInstance_create
              (self->provide_ports + port_id,self,'\x01',port_id,name,pack_program,
               (apx_program_t *)0x0);
    self_local._4_4_ =
         apx_portInstance_derive_properties(self->provide_ports + port_id,data_offset,data_size);
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_nodeInstance_create_provide_port(apx_nodeInstance_t* self, apx_portId_t port_id, char const* name,
   apx_program_t const* pack_program, uint32_t data_offset, uint32_t* data_size)
{
   if ((self != NULL) && (port_id < (apx_portId_t)self->num_provide_ports))
   {
      apx_portInstance_create(&self->provide_ports[port_id], self, APX_PROVIDE_PORT, port_id,
         name, pack_program, NULL);
      return apx_portInstance_derive_properties(&self->provide_ports[port_id], data_offset, data_size);
   }
   return APX_INVALID_ARGUMENT_ERROR;
}